

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

double __thiscall
BayesianGameIdenticalPayoff::ComputeValueJPol
          (BayesianGameIdenticalPayoff *this,JointPolicyDiscretePure *jpolBG)

{
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  double local_30;
  
  sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this);
  if (sVar3 == 0) {
    local_30 = 0.0;
  }
  else {
    uVar4 = 0;
    auVar6 = ZEXT1664(ZEXT816(0));
    local_30 = 0.0;
    do {
      uVar2 = (*(jpolBG->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                        (jpolBG,uVar4);
      (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this,uVar4);
      uVar5 = auVar6._0_8_;
      (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this,uVar4,(ulong)uVar2);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_30;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      auVar1 = vfmadd231sd_fma(auVar7,auVar6._0_16_,auVar1);
      local_30 = auVar1._0_8_;
      uVar4 = (ulong)((int)uVar4 + 1);
      sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this);
    } while (uVar4 < sVar3);
  }
  return local_30;
}

Assistant:

double BayesianGameIdenticalPayoff::ComputeValueJPol(const JointPolicyDiscretePure & jpolBG) const
{
    double v=0.0;
    for(Index jtI=0; jtI<GetNrJointTypes(); jtI++)
    {
        Index jaI = jpolBG.GetJointActionIndex(jtI);
        double p = GetProbability(jtI);
        double u = GetUtility(jtI, jaI);
        v += p*u;
    }
    return(v);

}